

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O3

Result read_file(char *filename,Buffer *buffer)

{
  FILE *__stream;
  size_t __size;
  u8 *__ptr;
  size_t sVar1;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    read_file_cold_2();
  }
  else {
    fseek(__stream,0,2);
    __size = ftell(__stream);
    fseek(__stream,0,0);
    __ptr = (u8 *)malloc(__size);
    sVar1 = fread(__ptr,__size,1,__stream);
    if (sVar1 == 1) {
      fclose(__stream);
      buffer->data = __ptr;
      buffer->size = __size;
      return OK;
    }
    read_file_cold_1();
  }
  return ERROR;
}

Assistant:

Result read_file(const char* filename, Buffer* buffer) {
  FILE* file = fopen(filename, "rb");
  CHECK_MSG(file, "unable to open file \"%s\".\n", filename);

  fseek(file, 0, SEEK_END);
  size_t size = ftell(file);
  fseek(file, 0, SEEK_SET);

  u8* data = malloc(size);
  CHECK_MSG(fread(data, size, 1, file) == 1, "fread failed.\n");
  fclose(file);
  buffer->data = data;
  buffer->size = size;

  return OK;
  ON_ERROR_CLOSE_FILE_AND_RETURN;
}